

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

void __thiscall HEkk::debugReportInitialBasis(HEkk *this)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  HighsInt iCol;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  int iVar8;
  int iVar9;
  
  iVar6 = (this->lp_).num_col_;
  iVar23 = (this->lp_).num_row_ + iVar6;
  local_90 = 0;
  local_80 = 0;
  local_88 = 0;
  uVar14 = 0;
  uVar21 = 0;
  for (uVar19 = 0; iVar7 = (int)local_80, iVar8 = (int)local_90, iVar9 = (int)local_88,
      iVar12 = (int)uVar14, (long)uVar19 < (long)iVar6; uVar19 = uVar19 + 1) {
    if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar19] == '\0') {
      uVar21 = (ulong)((int)uVar21 + 1);
    }
    else {
      cVar4 = (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19];
      if (cVar4 < '\x01') {
        if (cVar4 < '\0') {
          local_88 = (ulong)(iVar9 + 1);
        }
        else {
          dVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar19];
          pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar19;
          if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
            local_90 = (ulong)(iVar8 + 1);
          }
          else {
            local_80 = (ulong)(iVar7 + 1);
          }
        }
      }
      else {
        uVar14 = (ulong)(iVar12 + 1);
      }
      if (iVar23 < 0x19) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                    (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar19],
                    (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar19],
                    (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar19],uVar19 & 0xffffffff,uVar14,
                    local_88,local_80,local_90);
        iVar6 = (this->lp_).num_col_;
      }
    }
  }
  uVar15 = 0;
  uVar19 = 0;
  local_78 = 0;
  local_70 = 0;
  uVar20 = 0;
  uVar22 = 0;
  while( true ) {
    uVar5 = (this->lp_).num_row_;
    iVar18 = (int)uVar20;
    iVar13 = (int)uVar19;
    iVar6 = (int)local_70;
    iVar10 = (int)local_78;
    if ((int)uVar5 <= (int)uVar15) break;
    lVar11 = (long)(this->lp_).num_col_;
    if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar15 + lVar11] == '\0') {
      uVar22 = (ulong)((int)uVar22 + 1);
    }
    else {
      lVar2 = lVar11 + uVar15;
      cVar4 = (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15 + lVar11];
      if (cVar4 < '\x01') {
        if (cVar4 < '\0') {
          local_70 = (ulong)(iVar6 + 1);
        }
        else {
          dVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar2];
          pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar2;
          if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
            local_78 = (ulong)(iVar10 + 1);
          }
          else {
            uVar19 = (ulong)(iVar13 + 1);
          }
        }
      }
      else {
        uVar20 = (ulong)(iVar18 + 1);
      }
      if (iVar23 < 0x19) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                    (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2],
                    (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2],
                    (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2],uVar15 & 0xffffffff,uVar20,
                    local_70,uVar19,local_78);
      }
    }
    uVar15 = uVar15 + 1;
  }
  uVar16 = iVar9 + iVar12 + iVar7 + iVar8;
  uVar17 = iVar6 + iVar18 + iVar13 + iVar10;
  highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
              "For %d columns and %d rows\n   NonBasic |  Lower  Upper  Fixed   Free |    Basic\nCol %7d |%7d%7d%7d%7d |  %7d\nRow %7d |%7d%7d%7d%7d |  %7d\n----------------------------------------------------\n    %7d |%7d%7d%7d%7d |  %7d\n"
              ,(ulong)(uint)(this->lp_).num_col_,(ulong)uVar5,(ulong)uVar16,uVar14,local_88,local_80
              ,local_90,uVar21,(ulong)uVar17,uVar20,local_70,uVar19,local_78,uVar22,
              (ulong)(uVar17 + uVar16),(ulong)(uint)(iVar12 + iVar18),(ulong)(uint)(iVar6 + iVar9),
              (ulong)(uint)(iVar13 + iVar7),(ulong)(uint)(iVar8 + iVar10),
              (ulong)(uint)((int)uVar21 + (int)uVar22));
  return;
}

Assistant:

void HEkk::debugReportInitialBasis() {
  HighsInt num_col_basic = 0;
  HighsInt num_col_lower = 0;
  HighsInt num_col_upper = 0;
  HighsInt num_col_fixed = 0;
  HighsInt num_col_free = 0;
  HighsInt num_row_basic = 0;
  HighsInt num_row_lower = 0;
  HighsInt num_row_upper = 0;
  HighsInt num_row_fixed = 0;
  HighsInt num_row_free = 0;
  std::vector<double>& lower = info_.workLower_;
  std::vector<double>& upper = info_.workUpper_;
  std::vector<double>& value = info_.workValue_;
  const bool detail = lp_.num_col_ + lp_.num_row_ < 25;
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    HighsInt iVar = iCol;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_col_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_col_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_col_upper++;
    } else if (lower[iCol] == upper[iCol]) {
      num_col_fixed++;
    } else {
      num_col_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iCol, lower[iCol], value[iVar], upper[iCol],
                  num_col_lower, num_col_upper, num_col_fixed, num_col_free);
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = lp_.num_col_ + iRow;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_row_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_row_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_row_upper++;
    } else if (lower[iVar] == upper[iVar]) {
      num_row_fixed++;
    } else {
      num_row_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iRow, lower[iVar], value[iVar], upper[iVar],
                  num_row_lower, num_row_upper, num_row_fixed, num_row_free);
  }
  HighsInt num_col_nonbasic =
      num_col_lower + num_col_upper + num_col_fixed + num_col_free;
  HighsInt num_row_nonbasic =
      num_row_lower + num_row_upper + num_row_fixed + num_row_free;
  assert(num_col_basic + num_row_basic == lp_.num_row_);
  assert(num_col_nonbasic + num_row_nonbasic == lp_.num_col_);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "For %d columns and %d rows\n"
              "   NonBasic |  Lower  Upper  Fixed   Free |    Basic\n"
              "Col %7d |%7d%7d%7d%7d |  %7d\n"
              "Row %7d |%7d%7d%7d%7d |  %7d\n"
              "----------------------------------------------------\n"
              "    %7d |%7d%7d%7d%7d |  %7d\n",
              (int)lp_.num_col_, (int)lp_.num_row_, (int)num_col_nonbasic,
              (int)num_col_lower, (int)num_col_upper, (int)num_col_fixed,
              (int)num_col_free, (int)num_col_basic, (int)num_row_nonbasic,
              (int)num_row_lower, (int)num_row_upper, (int)num_row_fixed,
              (int)num_row_free, (int)num_row_basic,
              (int)num_col_nonbasic + (int)num_row_nonbasic,
              (int)num_col_lower + (int)num_row_lower,
              (int)num_col_upper + (int)num_row_upper,
              (int)num_col_fixed + (int)num_row_fixed,
              (int)num_col_free + (int)num_row_free,
              (int)num_col_basic + (int)num_row_basic);
}